

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall string_view_length_Test::TestBody(string_view_length_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_98;
  Message local_90;
  size_type local_88;
  uint local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  string_view sv2;
  AssertHelper local_50;
  Message local_48;
  size_type local_40;
  undefined4 local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  string_view sv1;
  string_view_length_Test *this_local;
  
  wabt::string_view::string_view((string_view *)&gtest_ar.message_);
  local_34 = 0;
  local_40 = wabt::string_view::length((string_view *)&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
            (local_30,"0U",(uint *)"sv1.length()",(unsigned_long *)&local_34,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (bVar1) {
    wabt::string_view::string_view((string_view *)&gtest_ar_1.message_,"hello");
    local_7c = 5;
    local_88 = wabt::string_view::length((string_view *)&gtest_ar_1.message_);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_78,"5U","sv2.length()",&local_7c,&local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                 ,0x8a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  }
  return;
}

Assistant:

TEST(string_view, length) {
  string_view sv1;
  ASSERT_EQ(0U, sv1.length());

  string_view sv2("hello");
  ASSERT_EQ(5U, sv2.length());
}